

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  ImGuiTabBar *pIVar1;
  int idx;
  ImPool<ImGuiTabBar> *this_local;
  
  i = this->FreeIdx;
  if (i == (this->Data).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Data,(this->Data).Size + 1);
    this->FreeIdx = this->FreeIdx + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTabBar>::operator[](&this->Data,i);
    this->FreeIdx = (pIVar1->Tabs).Size;
  }
  ImVector<ImGuiTabBar>::operator[](&this->Data,i);
  pIVar1 = (ImGuiTabBar *)operator_new(0x80);
  ImGuiTabBar::ImGuiTabBar(pIVar1);
  pIVar1 = ImVector<ImGuiTabBar>::operator[](&this->Data,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }